

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O3

void arg_cat_optionv(char *dest,size_t ndest,char *shortopts,char *longopts,char *datatype,
                    int optvalue,char *separator)

{
  bool bVar1;
  char *pcVar2;
  char *end;
  char *pcVar3;
  char *pcVar4;
  char cVar5;
  char *pcVar6;
  undefined4 in_register_0000008c;
  char *pcVar7;
  char *pcVar8;
  char *dest_3;
  char shortopt [3];
  char local_47 [3];
  int local_44;
  size_t local_40;
  char *local_38;
  
  local_44 = (int)datatype;
  local_38 = "";
  if ((char *)CONCAT44(in_register_0000008c,optvalue) != (char *)0x0) {
    local_38 = (char *)CONCAT44(in_register_0000008c,optvalue);
  }
  if (ndest == 0) {
    pcVar7 = (char *)0xc7;
    if (shortopts == (char *)0x0) goto LAB_00108db4;
LAB_00108cb7:
    bVar1 = true;
    local_40 = ndest;
    if (*shortopts != '\0') {
      do {
        pcVar6 = dest + (long)pcVar7;
        if (0 < (long)pcVar7) {
          do {
            if (*dest == '\0') break;
            dest = dest + 1;
          } while (dest < pcVar6);
        }
        pcVar7 = dest;
        if (dest < pcVar6) {
          *dest = '-';
          pcVar7 = dest + 1;
          if (dest + 1 < pcVar6) {
            dest[1] = '-';
            pcVar7 = dest + 2;
          }
        }
        dest = pcVar7;
        *dest = '\0';
        pcVar7 = pcVar6 + -(long)dest;
        pcVar3 = (char *)strcspn(shortopts,",");
        pcVar4 = pcVar7;
        if (pcVar3 < pcVar7) {
          pcVar4 = pcVar3;
        }
        strncat(dest,shortopts,(size_t)pcVar4);
        pcVar4 = shortopts + (long)pcVar3;
        cVar5 = shortopts[(long)pcVar3];
        if (cVar5 == ',') {
          pcVar3 = dest + (long)pcVar7;
          pcVar8 = local_38;
          if (0 < (long)pcVar7) {
            do {
              if (*dest == '\0') break;
              dest = dest + 1;
            } while (dest < pcVar3);
          }
          for (; (dest < pcVar3 && (*pcVar8 != '\0')); pcVar8 = pcVar8 + 1) {
            *dest = *pcVar8;
            dest = dest + 1;
          }
          *dest = '\0';
          pcVar7 = pcVar6 + -(long)dest;
          cVar5 = pcVar4[1];
          pcVar4 = pcVar4 + 1;
        }
        shortopts = pcVar4;
      } while (cVar5 != '\0');
      bVar1 = true;
      ndest = local_40;
    }
  }
  else {
    cVar5 = *(char *)ndest;
    pcVar6 = local_38;
    if (cVar5 == '\0') {
      if (shortopts != (char *)0x0) {
        pcVar4 = dest + 199;
LAB_00108c89:
        do {
          if (*dest == '\0') break;
          dest = dest + 1;
        } while (dest < pcVar4);
        goto joined_r0x00108c99;
      }
      pcVar7 = (char *)0xc7;
    }
    else {
      pcVar7 = (char *)0xc7;
      pcVar4 = (char *)ndest;
      do {
        local_47[0] = '-';
        local_47[1] = cVar5;
        local_47[2] = 0;
        pcVar8 = dest + (long)pcVar7;
        pcVar3 = local_47;
        if (0 < (long)pcVar7) {
          do {
            if (*dest == '\0') break;
            dest = dest + 1;
          } while (dest < pcVar8);
        }
        for (; (dest < pcVar8 && (*pcVar3 != '\0')); pcVar3 = pcVar3 + 1) {
          *dest = *pcVar3;
          dest = dest + 1;
        }
        *dest = '\0';
        pcVar7 = pcVar8 + -(long)dest;
        if (pcVar4[1] == '\0') break;
        pcVar3 = dest + (long)pcVar7;
        pcVar2 = local_38;
        if (0 < (long)pcVar7) {
          do {
            if (*dest == '\0') break;
            dest = dest + 1;
          } while (dest < pcVar3);
        }
        for (; (dest < pcVar3 && (*pcVar2 != '\0')); pcVar2 = pcVar2 + 1) {
          *dest = *pcVar2;
          dest = dest + 1;
        }
        pcVar4 = pcVar4 + 1;
        *dest = '\0';
        pcVar7 = pcVar8 + -(long)dest;
        cVar5 = *pcVar4;
      } while (cVar5 != '\0');
      if (shortopts != (char *)0x0) {
        pcVar4 = dest + (long)pcVar7;
        if (0 < (long)pcVar7) goto LAB_00108c89;
joined_r0x00108c99:
        for (; (dest < pcVar4 && (*pcVar6 != '\0')); pcVar6 = pcVar6 + 1) {
          *dest = *pcVar6;
          dest = dest + 1;
        }
        *dest = '\0';
        pcVar7 = pcVar4 + -(long)dest;
        goto LAB_00108cb7;
      }
    }
LAB_00108db4:
    bVar1 = false;
  }
  if (longopts == (char *)0x0) {
    return;
  }
  pcVar6 = dest;
  if (bVar1) {
    if (0 < (long)pcVar7) {
      do {
        if (*pcVar6 == '\0') break;
        pcVar6 = pcVar6 + 1;
      } while (pcVar6 < dest + (long)pcVar7);
    }
    if (pcVar6 < dest + (long)pcVar7) {
      *pcVar6 = '=';
LAB_00108e06:
      pcVar6 = pcVar6 + 1;
    }
  }
  else {
    if (ndest == 0) goto LAB_00108e12;
    if (0 < (long)pcVar7) {
      do {
        if (*pcVar6 == '\0') break;
        pcVar6 = pcVar6 + 1;
      } while (pcVar6 < dest + (long)pcVar7);
    }
    if (pcVar6 < dest + (long)pcVar7) {
      *pcVar6 = ' ';
      goto LAB_00108e06;
    }
  }
  *pcVar6 = '\0';
  pcVar7 = dest + ((long)pcVar7 - (long)pcVar6);
  dest = pcVar6;
LAB_00108e12:
  pcVar6 = dest + (long)pcVar7;
  if (local_44 == 0) {
    if (0 < (long)pcVar7) {
      do {
        if (*dest == '\0') break;
        dest = dest + 1;
      } while (dest < pcVar6);
    }
    for (; (dest < pcVar6 && (*longopts != '\0')); longopts = longopts + 1) {
      *dest = *longopts;
      dest = dest + 1;
    }
  }
  else {
    if (0 < (long)pcVar7) {
      do {
        if (*dest == '\0') break;
        dest = dest + 1;
      } while (dest < pcVar6);
    }
    if (dest < pcVar6) {
      *dest = '[';
      dest = dest + 1;
    }
    *dest = '\0';
    if (pcVar6 != dest && -1 < (long)pcVar6 - (long)dest) {
      do {
        if (*dest == '\0') break;
        dest = dest + 1;
      } while (dest < pcVar6);
    }
    for (; (dest < pcVar6 && (*longopts != '\0')); longopts = longopts + 1) {
      *dest = *longopts;
      dest = dest + 1;
    }
    *dest = '\0';
    if (pcVar6 != dest && -1 < (long)pcVar6 - (long)dest) {
      *dest = ']';
      dest = dest + 1;
    }
  }
  *dest = '\0';
  return;
}

Assistant:

static void arg_cat_optionv(char* dest, size_t ndest, const char* shortopts, const char* longopts, const char* datatype, int optvalue, const char* separator) {
    separator = separator ? separator : "";

    if (shortopts) {
        const char* c = shortopts;
        while (*c) {
            /* "-a|-b|-c" */
            char shortopt[3];

            /* note: shortopt array[] is initialiazed dynamically here to satisfy */
            /* a deficiency in the watcom compiler wrt static array initializers. */
            shortopt[0] = '-';
            shortopt[1] = *c;
            shortopt[2] = 0;

            arg_cat(&dest, shortopt, &ndest);
            if (*++c)
                arg_cat(&dest, separator, &ndest);
        }
    }

    /* put separator between long opts and short opts */
    if (shortopts && longopts)
        arg_cat(&dest, separator, &ndest);

    if (longopts) {
        const char* c = longopts;
        while (*c) {
            size_t ncspn;

            /* add "--" tag prefix */
            arg_cat(&dest, "--", &ndest);

            /* add comma separated option tag */
            ncspn = strcspn(c, ",");
#if (defined(__STDC_LIB_EXT1__) && defined(__STDC_WANT_LIB_EXT1__)) || (defined(__STDC_SECURE_LIB__) && defined(__STDC_WANT_SECURE_LIB__))
            strncat_s(dest, ndest, c, (ncspn < ndest) ? ncspn : ndest);
#else
            strncat(dest, c, (ncspn < ndest) ? ncspn : ndest);
#endif
            c += ncspn;

            /* add given separator in place of comma */
            if (*c == ',') {
                arg_cat(&dest, separator, &ndest);
                c++;
            }
        }
    }

    if (datatype) {
        if (longopts)
            arg_cat(&dest, "=", &ndest);
        else if (shortopts)
            arg_cat(&dest, " ", &ndest);

        if (optvalue) {
            arg_cat(&dest, "[", &ndest);
            arg_cat(&dest, datatype, &ndest);
            arg_cat(&dest, "]", &ndest);
        } else
            arg_cat(&dest, datatype, &ndest);
    }
}